

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggerTest.cpp
# Opt level: O3

int main(void)

{
  LogLevel LVar1;
  Logger *pLVar2;
  undefined1 local_338 [536];
  undefined1 local_120 [256];
  
  higan::Logger::SetLogLevel(DEBUG);
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              ((Logger *)local_338,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xb,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              ((Logger *)local_338,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xc,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              ((Logger *)local_338,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xd,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              ((Logger *)local_338,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xe,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"/root/log/test","");
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"test","");
  higan::Logger::SetLogToFile((string *)local_338,(string *)local_120,false);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              ((Logger *)local_338,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x12,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              ((Logger *)local_338,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x13,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              ((Logger *)local_338,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x14,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              ((Logger *)local_338,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x15,"main");
    higan::Fmt::Fmt((Fmt *)local_120,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<((Logger *)local_338,(Fmt *)local_120);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger((Logger *)local_338);
  }
  return 0;
}

Assistant:

int main()
{
	higan::Logger::SetLogLevel(higan::Logger::DEBUG);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	higan::Logger::SetLogToFile("/root/log/test", "test", false);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	return 0;
}